

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleUndefDirective(Preprocessor *this,Token directive)

{
  flat_hash_map<std::string_view,_MacroDef> *this_00;
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  uint64_t uVar13;
  UndefDirectiveSyntax *syntax;
  ulong uVar14;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  iterator pos;
  SourceRange range;
  Token nameToken;
  Token directive_local;
  string_view name;
  Trivia local_40;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  nameToken = expect(this,Identifier);
  if ((nameToken._0_4_ >> 0x10 & 1) == 0) {
    name = Token::valueText(&nameToken);
    this_00 = &this->macros;
    uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00
                        ,&name);
    uVar15 = uVar13 >> ((byte)(this->macros).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                              .arrays.groups_size_index & 0x3f);
    lVar16 = (uVar13 & 0xff) * 4;
    uVar6 = (&UNK_0040eb5c)[lVar16];
    uVar7 = (&UNK_0040eb5d)[lVar16];
    uVar8 = (&UNK_0040eb5e)[lVar16];
    bVar9 = (&UNK_0040eb5f)[lVar16];
    uVar14 = 0;
    do {
      pgVar2 = (this->macros).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
               .arrays.groups_;
      pgVar1 = pgVar2 + uVar15;
      bVar11 = pgVar1->m[0xf].n;
      auVar17[0] = -(pgVar1->m[0].n == uVar6);
      auVar17[1] = -(pgVar1->m[1].n == uVar7);
      auVar17[2] = -(pgVar1->m[2].n == uVar8);
      auVar17[3] = -(pgVar1->m[3].n == bVar9);
      auVar17[4] = -(pgVar1->m[4].n == uVar6);
      auVar17[5] = -(pgVar1->m[5].n == uVar7);
      auVar17[6] = -(pgVar1->m[6].n == uVar8);
      auVar17[7] = -(pgVar1->m[7].n == bVar9);
      auVar17[8] = -(pgVar1->m[8].n == uVar6);
      auVar17[9] = -(pgVar1->m[9].n == uVar7);
      auVar17[10] = -(pgVar1->m[10].n == uVar8);
      auVar17[0xb] = -(pgVar1->m[0xb].n == bVar9);
      auVar17[0xc] = -(pgVar1->m[0xc].n == uVar6);
      auVar17[0xd] = -(pgVar1->m[0xd].n == uVar7);
      auVar17[0xe] = -(pgVar1->m[0xe].n == uVar8);
      auVar17[0xf] = -(bVar11 == bVar9);
      uVar12 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
      if (uVar12 != 0) {
        ppVar3 = (this->macros).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                 .arrays.elements_;
        do {
          uVar5 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          __y = (basic_string_view<char,_std::char_traits<char>_> *)
                ((long)&ppVar3[uVar15 * 0xf].first._M_len + (ulong)(uVar5 << 5));
          bVar10 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_00,&name,__y);
          if (bVar10) {
            if (*(char *)((long)&__y[1]._M_str + 4) == '\0') {
              pos.p_ = (table_element_pointer)(pgVar2[uVar15].m + uVar5);
              pos.pc_ = (char_pointer)this_00;
              boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
              ::erase<false,_nullptr>
                        ((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::Preprocessor::MacroDef>_>_>
                          *)&stack0xffffffffffffffb0,pos);
            }
            else {
              range = Token::range(&nameToken);
              addDiag(this,(DiagCode)0x180004,range);
            }
            goto LAB_0019309e;
          }
          uVar12 = uVar12 - 1 & uVar12;
        } while (uVar12 != 0);
        bVar11 = pgVar2[uVar15].m[0xf].n;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar11) == 0) break;
      uVar4 = (this->macros).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
              .arrays.groups_size_mask;
      lVar16 = uVar15 + uVar14;
      uVar14 = uVar14 + 1;
      uVar15 = lVar16 + 1U & uVar4;
    } while (uVar14 <= uVar4);
  }
LAB_0019309e:
  syntax = BumpAllocator::
           emplace<slang::syntax::UndefDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&directive_local,&nameToken);
  Trivia::Trivia(&local_40,Directive,(SyntaxNode *)syntax);
  return local_40;
}

Assistant:

Trivia Preprocessor::handleUndefDirective(Token directive) {
    Token nameToken = expect(TokenKind::Identifier);

    if (!nameToken.isMissing()) {
        std::string_view name = nameToken.valueText();
        auto it = macros.find(name);
        if (it != macros.end()) {
            if (!it->second.builtIn)
                macros.erase(it);
            else
                addDiag(diag::UndefineBuiltinDirective, nameToken.range());
        }
    }

    auto result = alloc.emplace<UndefDirectiveSyntax>(directive, nameToken);
    return Trivia(TriviaKind::Directive, result);
}